

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  Clause *c_00;
  Clause *c;
  int j;
  int i;
  vec<unsigned_int> *cs_local;
  Solver *this_local;
  
  c._0_4_ = 0;
  c._4_4_ = 0;
  while( true ) {
    iVar3 = vec<unsigned_int>::size(cs);
    if (iVar3 <= c._4_4_) break;
    puVar4 = vec<unsigned_int>::operator[](cs,c._4_4_);
    c_00 = ClauseAllocator::operator[](&this->ca,*puVar4);
    bVar2 = satisfied(this,c_00);
    if (bVar2) {
      puVar4 = vec<unsigned_int>::operator[](cs,c._4_4_);
      removeClause(this,*puVar4);
    }
    else {
      puVar4 = vec<unsigned_int>::operator[](cs,c._4_4_);
      uVar1 = *puVar4;
      puVar4 = vec<unsigned_int>::operator[](cs,(int)c);
      *puVar4 = uVar1;
      c._0_4_ = (int)c + 1;
    }
    c._4_4_ = c._4_4_ + 1;
  }
  vec<unsigned_int>::shrink(cs,c._4_4_ - (int)c);
  return;
}

Assistant:

void Solver::removeSatisfied(vec<CRef>& cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++){
        Clause& c = ca[cs[i]];
        if (satisfied(c)) 
            removeClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    cs.shrink(i - j);
}